

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derSIDEnc(octet *der,u32 val)

{
  size_t pos;
  u32 t;
  size_t count;
  u32 val_local;
  octet *der_local;
  
  count = 0;
  t = val;
  if (val == 0) {
    count = 1;
  }
  else {
    for (; t != 0; t = t >> 7) {
      count = count + 1;
    }
  }
  if (der != (octet *)0x0) {
    der[count - 1] = (byte)val & 0x7f;
    pos = count - 1;
    t = val;
    while (pos != 0) {
      t = t >> 7;
      der[pos - 1] = (byte)t & 0x7f | 0x80;
      pos = pos - 1;
    }
  }
  return count;
}

Assistant:

static size_t derSIDEnc(octet* der, u32 val)
{
	size_t count = 0;
	u32 t = val;
	// длина DER-кода
	if (val)
		for (; t; t >>= 7, count++);
	else
		++count;
	// кодирование
	if (der)
	{
		size_t pos = count - 1;
		ASSERT(memIsValid(der, count));
		der[pos] = (t = val) & 127;
		while (pos--)
			t >>= 7, der[pos] = 128 | (t & 127);
	}
	return count;
}